

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O1

void CuSuiteDetails(CuSuite *testSuite,CuString *details)

{
  CuTest *pCVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  
  if (testSuite->failCount == 1) {
    CuStringAppend(details,"There was 1 failure:\n");
  }
  else {
    if (testSuite->failCount == 0) {
      pcVar2 = "tests";
      if (testSuite->count == 1) {
        pcVar2 = "test";
      }
      CuStringAppendFormat(details,"OK (%d %s)\n",(ulong)(uint)testSuite->count,pcVar2);
      return;
    }
    CuStringAppendFormat(details,"There were %d failures:\n");
  }
  if (0 < testSuite->count) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      pCVar1 = testSuite->list[lVar4];
      if (pCVar1->failed != 0) {
        uVar3 = uVar3 + 1;
        CuStringAppendFormat(details,"%d) %s: %s\n",(ulong)uVar3,pCVar1->name,pCVar1->message);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < testSuite->count);
  }
  CuStringAppend(details,"\n!!!FAILURES!!!\n");
  CuStringAppendFormat(details,"Runs: %d ",(ulong)(uint)testSuite->count);
  CuStringAppendFormat(details,"Passes: %d ",(ulong)(uint)(testSuite->count - testSuite->failCount))
  ;
  CuStringAppendFormat(details,"Fails: %d\n",(ulong)(uint)testSuite->failCount);
  return;
}

Assistant:

void CuSuiteDetails(CuSuite* testSuite, CuString* details)
{
	int i;
	int failCount = 0;

	if (testSuite->failCount == 0)
	{
		int passCount = testSuite->count - testSuite->failCount;
		const char* testWord = passCount == 1 ? "test" : "tests";
		CuStringAppendFormat(details, "OK (%d %s)\n", passCount, testWord);
	}
	else
	{
		if (testSuite->failCount == 1)
			CuStringAppend(details, "There was 1 failure:\n");
		else
			CuStringAppendFormat(details, "There were %d failures:\n", testSuite->failCount);

		for (i = 0 ; i < testSuite->count ; ++i)
		{
			CuTest* testCase = testSuite->list[i];
			if (testCase->failed)
			{
				failCount++;
				CuStringAppendFormat(details, "%d) %s: %s\n",
					failCount, testCase->name, testCase->message);
			}
		}
		CuStringAppend(details, "\n!!!FAILURES!!!\n");

		CuStringAppendFormat(details, "Runs: %d ",   testSuite->count);
		CuStringAppendFormat(details, "Passes: %d ", testSuite->count - testSuite->failCount);
		CuStringAppendFormat(details, "Fails: %d\n",  testSuite->failCount);
	}
}